

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Tags::Tag::Parse(Tag *this,IMkvReader *pReader,longlong pos,longlong size)

{
  longlong *pos_00;
  IMkvReader *in_RCX;
  longlong *in_RDX;
  longlong in_RDI;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong *in_stack_ffffffffffffffb8;
  IMkvReader *in_stack_ffffffffffffffc0;
  longlong in_stack_ffffffffffffffc8;
  longlong *local_20;
  
  pos_00 = (longlong *)((long)in_RDX + (long)in_RCX);
  local_20 = in_RDX;
  while( true ) {
    if ((long)pos_00 <= (long)local_20) {
      if (local_20 != pos_00) {
        return -2;
      }
      return 0;
    }
    in_stack_ffffffffffffffb8 =
         (longlong *)
         ParseElementHeader(in_RCX,pos_00,in_stack_ffffffffffffffc8,
                            (longlong *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if ((long)in_stack_ffffffffffffffb8 < 0) break;
    if (in_stack_ffffffffffffffc0 != (IMkvReader *)0x0) {
      if ((in_stack_ffffffffffffffc8 == 0x67c8) &&
         (in_stack_ffffffffffffffb8 =
               (longlong *)
               ParseSimpleTag((Tag *)0x67c8,in_stack_ffffffffffffffc0,
                              (longlong)in_stack_ffffffffffffffb8,in_RDI),
         (long)in_stack_ffffffffffffffb8 < 0)) {
        return (long)in_stack_ffffffffffffffb8;
      }
      local_20 = (longlong *)((long)&in_stack_ffffffffffffffc0->_vptr_IMkvReader + (long)local_20);
      if ((long)pos_00 < (long)local_20) {
        return -2;
      }
    }
  }
  return (long)in_stack_ffffffffffffffb8;
}

Assistant:

long Tags::Tag::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)
      return status;

    if (size == 0)  // 0 length tag, read another
      continue;

    if (id == libwebm::kMkvSimpleTag) {
      status = ParseSimpleTag(pReader, pos, size);

      if (status < 0)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}